

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteResult.h
# Opt level: O2

void __thiscall
oout::SuiteResult::SuiteResult<oout::TestResult,oout::TestResult>
          (SuiteResult *this,shared_ptr<oout::TestResult> *tests,
          shared_ptr<oout::TestResult> *tests_1)

{
  long lVar1;
  initializer_list<std::shared_ptr<const_oout::Result>_> __l;
  allocator_type local_51;
  _List_base<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
  local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38 [2];
  __shared_ptr<oout::Result_const,(__gnu_cxx::_Lock_policy)2> local_28 [16];
  
  std::__shared_ptr<oout::Result_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<oout::TestResult,void>
            ((__shared_ptr<oout::Result_const,(__gnu_cxx::_Lock_policy)2> *)local_38,
             &tests->super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Result_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<oout::TestResult,void>
            (local_28,&tests_1->super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>);
  __l._M_len = 2;
  __l._M_array = (iterator)local_38;
  std::__cxx11::
  list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>::
  list((list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
        *)&local_50,__l,&local_51);
  SuiteResult(this,(list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
                    *)&local_50);
  std::__cxx11::
  _List_base<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
  ::_M_clear(&local_50);
  lVar1 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_38[0]._M_pi + lVar1));
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != -8);
  return;
}

Assistant:

explicit SuiteResult(const std::shared_ptr<T> & ... tests)
		: SuiteResult(std::list<std::shared_ptr<const Result>>{
			tests...
		})
	{
	}